

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common-inl.h
# Opt level: O2

void __thiscall spdlog::spdlog_ex::spdlog_ex(spdlog_ex *this,string *msg,int last_errno)

{
  basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_> *buf;
  memory_buf_t outbuf;
  string sStack_158;
  basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_> local_138;
  
  *(undefined ***)this = &PTR__spdlog_ex_004838f8;
  (this->msg_)._M_dataplus._M_p = (pointer)&(this->msg_).field_2;
  (this->msg_)._M_string_length = 0;
  (this->msg_).field_2._M_local_buf[0] = '\0';
  local_138.super_buffer<char>.ptr_ = local_138.store_;
  local_138.super_buffer<char>.size_ = 0;
  local_138.super_buffer<char>.grow_ =
       ::fmt::v11::basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_>::grow;
  local_138.super_buffer<char>.capacity_ = 0xfa;
  ::fmt::v11::format_system_error(&local_138.super_buffer<char>,last_errno,(msg->_M_dataplus)._M_p);
  ::fmt::v11::to_string<250ul>(&sStack_158,(v11 *)&local_138,buf);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->msg_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sStack_158);
  std::__cxx11::string::~string((string *)&sStack_158);
  ::fmt::v11::basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_>::deallocate
            (&local_138);
  return;
}

Assistant:

SPDLOG_INLINE spdlog_ex::spdlog_ex(const std::string &msg, int last_errno) {
#ifdef SPDLOG_USE_STD_FORMAT
    msg_ = std::system_error(std::error_code(last_errno, std::generic_category()), msg).what();
#else
    memory_buf_t outbuf;
    fmt::format_system_error(outbuf, last_errno, msg.c_str());
    msg_ = fmt::to_string(outbuf);
#endif
}